

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::iterate(UserDefinedIOCase *this)

{
  undefined4 programGL_00;
  int iVar1;
  deUint32 dVar2;
  TestLog *log_00;
  undefined4 extraout_var;
  char *pcVar3;
  Functions *gl_00;
  ShaderProgram *this_00;
  Archive *archive;
  size_type sVar4;
  MessageBuilder *pMVar5;
  const_reference pvVar6;
  ConstPixelBufferAccess *result_00;
  VertexArrayBinding *local_890;
  int local_834;
  int local_830;
  int local_82c;
  allocator<char> local_799;
  string local_798;
  string local_778;
  MessageBuilder local_758;
  allocator<char> local_5d1;
  string local_5d0;
  MessageBuilder local_5b0;
  int local_430;
  value_type local_42c;
  int vertexNdx;
  int numTEInputs;
  int topLevelArraySize;
  size_type local_400;
  MessageBuilder local_3f8;
  allocator<char> local_271;
  string local_270;
  ConstPixelBufferAccess local_250;
  ConstPixelBufferAccess local_228;
  undefined1 local_1fa;
  allocator<char> local_1f9;
  undefined1 local_1f8 [6];
  bool success;
  undefined1 local_1d8 [8];
  TextureLevel reference;
  Surface pixels;
  Result tfResult;
  string local_170;
  undefined1 *local_150;
  undefined1 local_148 [8];
  VertexArrayBinding bindings [1];
  undefined1 local_e0 [8];
  ResultCollector result;
  TFHandler tfHandler;
  int numVertices;
  deUint32 programGL;
  Functions *gl;
  RandomViewport viewport;
  RenderContext *renderCtx;
  TestLog *log;
  UserDefinedIOCase *this_local;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  viewport._8_8_ = Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*((RenderContext *)viewport._8_8_)->_vptr_RenderContext[4])();
  pcVar3 = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(pcVar3);
  gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&gl,(RenderTarget *)CONCAT44(extraout_var,iVar1),0x100,0x100,dVar2);
  gl_00 = (Functions *)(**(code **)(*(long *)viewport._8_8_ + 0x18))();
  this_00 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  tfHandler.m_tfPrimQuery.super_ObjectWrapper._20_4_ = glu::ShaderProgram::getProgram(this_00);
  tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object =
       referenceVertexCount
                 (this->m_primitiveType,SPACINGMODE_EQUAL,false,iterate::attributes,
                  iterate::attributes + 2);
  TransformFeedbackHandler<unsigned_int>::TransformFeedbackHandler
            ((TransformFeedbackHandler<unsigned_int> *)((long)&result.m_message.field_2 + 8),
             (RenderContext *)viewport._8_8_,tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_e0);
  (*gl_00->useProgram)(tfHandler.m_tfPrimQuery.super_ObjectWrapper._20_4_);
  setViewport(gl_00,(RandomViewport *)&gl);
  (*gl_00->patchParameteri)(0x8e72,10);
  (*gl_00->clearColor)(0.0,0.0,0.0,1.0);
  (*gl_00->clear)(0x4000);
  tfResult.varying.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_150 = local_148;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"in_v_attr",
             (allocator<char> *)
             ((long)&tfResult.varying.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  glu::va::Float((VertexArrayBinding *)local_148,&local_170,1,10,0,iterate::attributes);
  tfResult.varying.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tfResult.varying.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  programGL_00 = tfHandler.m_tfPrimQuery.super_ObjectWrapper._20_4_;
  dVar2 = outputPrimitiveTypeGL(this->m_primitiveType,false);
  TransformFeedbackHandler<unsigned_int>::renderAndGetPrimitives
            ((Result *)&pixels.m_pixels.m_cap,
             (TransformFeedbackHandler<unsigned_int> *)((long)&result.m_message.field_2 + 8),
             programGL_00,dVar2,1,(VertexArrayBinding *)local_148,10);
  getPixels((Surface *)&reference.m_data.m_cap,(RenderContext *)viewport._8_8_,(RandomViewport *)&gl
           );
  archive = tcu::TestContext::getArchive
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1f8,pcVar3,&local_1f9);
  getPNG((TextureLevel *)local_1d8,archive,(string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  tcu::TextureLevel::getAccess(&local_228,(TextureLevel *)local_1d8);
  tcu::Surface::getAccess(&local_250,(Surface *)&reference.m_data.m_cap);
  result_00 = &local_250;
  local_1fa = tcu::fuzzyCompare(log_00,"ImageComparison","Image Comparison",&local_228,result_00,
                                0.02,COMPARE_LOG_RESULT);
  if (!(bool)local_1fa) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"Image comparison failed",&local_271);
    tcu::ResultCollector::fail((ResultCollector *)local_e0,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_1d8);
  tcu::Surface::~Surface((Surface *)&reference.m_data.m_cap);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&tfResult);
  if ((deUint32)sVar4 == tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object) {
    if (this->m_ioType == IO_TYPE_PER_PATCH) {
      local_82c = 1;
    }
    else {
      if (this->m_ioType == IO_TYPE_PER_PATCH_ARRAY) {
        local_830 = 3;
      }
      else {
        if (this->m_ioType == IO_TYPE_PER_PATCH_BLOCK) {
          local_834 = 1;
        }
        else {
          local_834 = 5;
          if (this->m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
            local_834 = 2;
          }
        }
        local_830 = local_834;
      }
      local_82c = local_830;
    }
    vertexNdx = local_82c;
    iVar1 = numBasicSubobjectsInElementType(&this->m_tesInputs);
    local_42c = iVar1 * vertexNdx;
    for (local_430 = 0; local_430 < (int)tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object;
        local_430 = local_430 + 1) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&tfResult,
                          (long)local_430);
      if (local_42c < *pvVar6) {
        tcu::TestLog::operator<<(&local_5b0,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_5b0,
                            (char (*) [49])"Failure: out_te_firstFailedInputIndex has value ");
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&tfResult,
                            (long)local_430);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvVar6);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [26])", should be in range [0, ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&local_42c);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0xf2b90f);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5b0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5d0,"Invalid transform feedback output",&local_5d1);
        tcu::ResultCollector::fail((ResultCollector *)local_e0,&local_5d0);
        std::__cxx11::string::~string((string *)&local_5d0);
        std::allocator<char>::~allocator(&local_5d1);
      }
      else {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&tfResult,
                            (long)local_430);
        if (*pvVar6 != local_42c) {
          tcu::TestLog::operator<<(&local_758,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (&local_758,
                              (char (*) [61])
                              "Failure: in tessellation evaluation shader, check for input ");
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&tfResult,
                              (long)local_430);
          (anonymous_namespace)::UserDefinedIOCase::basicSubobjectAtIndex_abi_cxx11_
                    (&local_778,(UserDefinedIOCase *)(ulong)*pvVar6,(int)this + 0xd8,
                     (vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                      *)(ulong)(uint)vertexNdx,(int)result_00);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_778);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [8])0xf44582);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_778);
          tcu::MessageBuilder::~MessageBuilder(&local_758);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_798,"Invalid input value in tessellation evaluation shader",
                     &local_799);
          tcu::ResultCollector::fail((ResultCollector *)local_e0,&local_798);
          std::__cxx11::string::~string((string *)&local_798);
          std::allocator<char>::~allocator(&local_799);
        }
      }
    }
  }
  else {
    tcu::TestLog::operator<<(&local_3f8,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_3f8,(char (*) [38])"Failure: transform feedback returned ");
    local_400 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&tfResult);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_400);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [21])" vertices; expected ");
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(int *)&tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&topLevelArraySize,"Wrong number of vertices",
               (allocator<char> *)((long)&numTEInputs + 3));
    tcu::ResultCollector::fail((ResultCollector *)local_e0,(string *)&topLevelArraySize);
    std::__cxx11::string::~string((string *)&topLevelArraySize);
    std::allocator<char>::~allocator((allocator<char> *)((long)&numTEInputs + 3));
  }
  TransformFeedbackHandler<unsigned_int>::Result::~Result((Result *)&pixels.m_pixels.m_cap);
  local_890 = (VertexArrayBinding *)&bindings[0].pointer.data;
  do {
    local_890 = local_890 + -1;
    glu::VertexArrayBinding::~VertexArrayBinding(local_890);
  } while (local_890 != (VertexArrayBinding *)local_148);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_e0,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_e0);
  TransformFeedbackHandler<unsigned_int>::~TransformFeedbackHandler
            ((TransformFeedbackHandler<unsigned_int> *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

UserDefinedIOCase::IterateResult UserDefinedIOCase::iterate (void)
{
	typedef TransformFeedbackHandler<deUint32> TFHandler;

	TestLog&				log						= m_testCtx.getLog();
	const RenderContext&	renderCtx				= m_context.getRenderContext();
	const RandomViewport	viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&	gl						= renderCtx.getFunctions();
	static const float		attributes[6+2+2]		= { /* inner */ 3.0f, 4.0f, /* outer */ 5.0f, 6.0f, 7.0f, 8.0f, /* pos. scale */ 1.2f, 1.3f, /* pos. offset */ -0.3f, -0.4f };
	const deUint32			programGL				= m_program->getProgram();
	const int				numVertices				= referenceVertexCount(m_primitiveType, SPACINGMODE_EQUAL, false, &attributes[0], &attributes[2]);
	const TFHandler			tfHandler				(renderCtx, numVertices);
	tcu::ResultCollector	result;

	gl.useProgram(programGL);
	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, DE_LENGTH_OF_ARRAY(attributes));

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	{
		const glu::VertexArrayBinding	bindings[]	= { glu::va::Float("in_v_attr", 1, DE_LENGTH_OF_ARRAY(attributes), 0, &attributes[0]) };
		const TFHandler::Result			tfResult	= tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, false),
																					   DE_LENGTH_OF_ARRAY(bindings), &bindings[0], DE_LENGTH_OF_ARRAY(attributes));

		{
			const tcu::Surface			pixels		= getPixels(renderCtx, viewport);
			const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePath.c_str());
			const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), pixels.getAccess(), 0.02f, tcu::COMPARE_LOG_RESULT);

			if (!success)
				result.fail("Image comparison failed");
		}

		if ((int)tfResult.varying.size() != numVertices)
		{
			log << TestLog::Message << "Failure: transform feedback returned " << tfResult.varying.size() << " vertices; expected " << numVertices << TestLog::EndMessage;
			result.fail("Wrong number of vertices");
		}
		else
		{
			const int topLevelArraySize		= (m_ioType == IO_TYPE_PER_PATCH				? 1
											 : m_ioType == IO_TYPE_PER_PATCH_ARRAY			? NUM_PER_PATCH_ARRAY_ELEMS
											 : m_ioType == IO_TYPE_PER_PATCH_BLOCK			? 1
											 : m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
											 : (int)NUM_OUTPUT_VERTICES);
			const int numTEInputs			= numBasicSubobjectsInElementType(m_tesInputs) * topLevelArraySize;

			for (int vertexNdx = 0; vertexNdx < (int)numVertices; vertexNdx++)
			{
				if (tfResult.varying[vertexNdx] > (deUint32)numTEInputs)
				{
					log << TestLog::Message << "Failure: out_te_firstFailedInputIndex has value " << tfResult.varying[vertexNdx]
											<< ", should be in range [0, " << numTEInputs << "]" << TestLog::EndMessage;
					result.fail("Invalid transform feedback output");
				}
				else if (tfResult.varying[vertexNdx] != (deUint32)numTEInputs)
				{
					log << TestLog::Message << "Failure: in tessellation evaluation shader, check for input "
											<< basicSubobjectAtIndex(tfResult.varying[vertexNdx], m_tesInputs, topLevelArraySize) << " failed" << TestLog::EndMessage;
					result.fail("Invalid input value in tessellation evaluation shader");
				}
			}
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}